

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

int compute_minrun(uint64_t size)

{
  long lVar1;
  byte bVar2;
  
  lVar1 = 0x3f;
  if (size != 0) {
    for (; size >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  bVar2 = 0x3a - ((byte)lVar1 ^ 0x3f);
  return ((int)(size >> (bVar2 & 0x3f)) + 1) - (uint)((~(-1L << (bVar2 & 0x3f)) & size) == 0);
}

Assistant:

static __inline int compute_minrun(const uint64_t size) {
  const int top_bit = 64 - CLZ(size);
  const int shift = MAX(top_bit, 6) - 6;
  const int minrun = (int)(size >> shift);
  const uint64_t mask = (1ULL << shift) - 1;

  if (mask & size) {
    return minrun + 1;
  }

  return minrun;
}